

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Helper.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
adios2::format::BP5Helper::BuildFixedNodeContrib
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,BP5Helper *this,
          digest attrHash,size_t attrSize,
          vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          *MMBlocks,size_t MetaEncodeSize,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *WriterDataPositions)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,0x90);
  pcVar1 = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *(BP5Helper **)pcVar1 = this;
  *(uint64_t *)(pcVar1 + 8) = attrHash.x[0];
  *(uint64_t *)(pcVar1 + 0x10) = attrHash.x[1];
  *(long *)(pcVar1 + 0x18) = *(long *)(attrSize + 8) - *(long *)attrSize >> 5;
  uVar5 = 0;
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
    lVar2 = *(long *)attrSize;
    if (uVar5 < (ulong)(*(long *)(attrSize + 8) - lVar2 >> 5)) {
      memcpy(pcVar1 + lVar4 * 2 + 0x20,*(void **)(lVar2 + 0x10 + lVar4 * 4),
             *(size_t *)(lVar2 + 0x18 + lVar4 * 4));
      uVar3 = *(long *)(lVar2 + 8 + lVar4 * 4) + 7U & 0xfffffffffffffff8;
    }
    else {
      uVar3 = 0;
    }
    *(ulong *)(pcVar1 + lVar4 + 0x60) = uVar3;
    uVar5 = uVar5 + 1;
  }
  *(vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    **)(pcVar1 + 0x80) = MMBlocks;
  *(undefined8 *)(pcVar1 + 0x88) = **(undefined8 **)MetaEncodeSize;
  return __return_storage_ptr__;
}

Assistant:

std::vector<char>
BP5Helper::BuildFixedNodeContrib(const digest attrHash, const size_t attrSize,
                                 const std::vector<BP5Base::MetaMetaInfoBlock> MMBlocks,
                                 const size_t MetaEncodeSize,
                                 const std::vector<uint64_t> WriterDataPositions)
{
    /*
     * WriterDataPositions comes in as a vector, but in current usage,
     * that vector only has a single entry
     *
     * MMBlocks may have more than FIXED_MMB_SLOT_COUNT entries, and
     * if so they will be handled in a special phase.
     */
    std::vector<char> ret;
    size_t len = sizeof(node_contrib);
    ret.resize(len);
    auto NC = reinterpret_cast<node_contrib *>(ret.data());
    NC->AttrHash = attrHash;
    NC->AttrSize = attrSize;
    NC->MMBCount = MMBlocks.size();
    for (size_t i = 0; i < FIXED_MMB_SLOT_COUNT; i++)
    {
        if (i < MMBlocks.size())
        {
            auto MM = &MMBlocks[i];
            std::memcpy(&NC->MMBArray[i].x[0], MM->MetaMetaID, MM->MetaMetaIDLen);
            size_t AlignedSize = ((MM->MetaMetaInfoLen + 7) & ~0x7);
            NC->MMBSizeArray[i] = AlignedSize;
        }
        else
        {
            NC->MMBSizeArray[i] = 0;
        }
    }
    NC->MetaEncodeSize = MetaEncodeSize;
    NC->WriterDataPosition = WriterDataPositions[0];
    return ret;
}